

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  bool_storage *this_00;
  int64_storage *this_01;
  int64_t iVar2;
  uint64_storage *this_02;
  uint64_t uVar3;
  string *s;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  json_runtime_error<std::domain_error,_void> *this_03;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  bool local_1;
  
  jVar1 = storage_kind(in_RDI);
  switch(jVar1) {
  case boolean:
    this_00 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
                        (in_stack_ffffffffffffffa0);
    local_1 = bool_storage::value(this_00);
    break;
  case int64:
    this_01 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::int64_storage>
                        (in_stack_ffffffffffffffa0);
    iVar2 = int64_storage::value(this_01);
    local_1 = iVar2 != 0;
    break;
  case uint64:
    this_02 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
                        (in_stack_ffffffffffffffa0);
    uVar3 = uint64_storage::value(this_02);
    local_1 = uVar3 != 0;
    break;
  default:
    s = (string *)__cxa_allocate_exception(0x18);
    this_03 = (json_runtime_error<std::domain_error,_void> *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_03,s);
    __cxa_throw(s,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case json_const_reference:
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffa0);
    json_const_reference_storage::value((json_const_reference_storage *)0x3ddc86);
    local_1 = as_bool(in_stack_ffffffffffffffe8);
    break;
  case json_reference:
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffa0);
    json_reference_storage::value((json_reference_storage *)0x3ddcab);
    local_1 = as_bool(in_stack_ffffffffffffffe8);
  }
  return local_1;
}

Assistant:

bool as_bool() const 
        {
            switch (storage_kind())
            {
                case json_storage_kind::boolean:
                    return cast<bool_storage>().value();
                case json_storage_kind::int64:
                    return cast<int64_storage>().value() != 0;
                case json_storage_kind::uint64:
                    return cast<uint64_storage>().value() != 0;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_bool();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_bool();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a bool"));
            }
        }